

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O3

void __thiscall
QListView::selectionChanged(QListView *this,QItemSelection *selected,QItemSelection *deselected)

{
  char cVar1;
  int iVar2;
  long in_FS_OFFSET;
  QArrayData *local_a0;
  code **local_98;
  long local_90;
  QArrayData *local_88;
  code **ppcStack_80;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_78;
  code *local_68;
  code *pcStack_60;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_58;
  code *local_48;
  undefined8 uStack_40;
  QListView *pQStack_38;
  int local_30;
  undefined4 uStack_2c;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  cVar1 = QAccessible::isActive();
  if (cVar1 != '\0') {
    QItemSelection::indexes();
    local_48 = (code *)0xffffffffffffffff;
    uStack_40 = 0;
    pQStack_38 = (QListView *)0x0;
    if (local_78.ptr == (QAbstractItemModel *)0x0) {
      ppcStack_80 = &local_48;
    }
    local_68 = *ppcStack_80;
    pcStack_60 = ppcStack_80[1];
    local_58.ptr = (QAbstractItemModel *)ppcStack_80[2];
    if (local_88 != (QArrayData *)0x0) {
      LOCK();
      (local_88->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_88->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_88->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_88,0x18,0x10);
      }
    }
    if (((-1 < (int)local_68) && (-1 < (long)local_68)) &&
       (local_58.ptr != (QAbstractItemModel *)0x0)) {
      iVar2 = visualIndex(this,(QModelIndex *)&local_68);
      local_48 = QFont::strikeOut;
      uStack_40 = 0xaaaaaaaa00008007;
      _local_30 = CONCAT44(0xaaaaaaaa,iVar2);
      pQStack_38 = this;
      QAccessible::updateAccessibility((QAccessibleEvent *)&local_48);
      QAccessibleEvent::~QAccessibleEvent((QAccessibleEvent *)&local_48);
    }
    QItemSelection::indexes();
    local_48 = (code *)0xffffffffffffffff;
    uStack_40 = 0;
    pQStack_38 = (QListView *)0x0;
    if (local_90 == 0) {
      local_98 = &local_48;
    }
    local_88 = (QArrayData *)*local_98;
    ppcStack_80 = (code **)local_98[1];
    local_78.ptr = (QAbstractItemModel *)local_98[2];
    if (local_a0 != (QArrayData *)0x0) {
      LOCK();
      (local_a0->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_a0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_a0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_a0,0x18,0x10);
      }
    }
    if (((-1 < (int)local_88) && (-1 < (long)local_88)) &&
       (local_78.ptr != (QAbstractItemModel *)0x0)) {
      iVar2 = visualIndex(this,(QModelIndex *)&local_88);
      local_48 = QFont::strikeOut;
      uStack_40 = 0xaaaaaaaa00008008;
      _local_30 = CONCAT44(0xaaaaaaaa,iVar2);
      pQStack_38 = this;
      QAccessible::updateAccessibility((QAccessibleEvent *)&local_48);
      QAccessibleEvent::~QAccessibleEvent((QAccessibleEvent *)&local_48);
    }
  }
  QAbstractItemView::selectionChanged((QAbstractItemView *)this,selected,deselected);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QListView::selectionChanged(const QItemSelection &selected,
                                 const QItemSelection &deselected)
{
#if QT_CONFIG(accessibility)
    if (QAccessible::isActive()) {
        // ### does not work properly for selection ranges.
        QModelIndex sel = selected.indexes().value(0);
        if (sel.isValid()) {
            int entry = visualIndex(sel);
            QAccessibleEvent event(this, QAccessible::SelectionAdd);
            event.setChild(entry);
            QAccessible::updateAccessibility(&event);
        }
        QModelIndex desel = deselected.indexes().value(0);
        if (desel.isValid()) {
            int entry = visualIndex(desel);
            QAccessibleEvent event(this, QAccessible::SelectionRemove);
            event.setChild(entry);
            QAccessible::updateAccessibility(&event);
        }
    }
#endif
    QAbstractItemView::selectionChanged(selected, deselected);
}